

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O3

NodeBase * __thiscall
SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::EditingIterator::UnlinkCurrentNode
          (EditingIterator *this)

{
  RealCount *pRVar1;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *pSVar2;
  Type TVar3;
  NodeBase *addr;
  code *pcVar4;
  NodeBase NVar5;
  bool bVar6;
  undefined4 *puVar7;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *pSVar8;
  NodeBase local_30;
  
  pSVar2 = (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)
           (this->super_Iterator).current;
  pSVar8 = pSVar2;
  if (pSVar2 == (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x101,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar6) goto LAB_0077d2f6;
    *puVar7 = 0;
    pSVar8 = (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)
             (this->super_Iterator).current;
  }
  if (pSVar8 == (this->super_Iterator).list) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x102,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar6) goto LAB_0077d2f6;
    *puVar7 = 0;
  }
  if (this->last == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x103,"(last != nullptr)","last != nullptr");
    if (!bVar6) {
LAB_0077d2f6:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  TVar3.ptr = (((this->super_Iterator).current)->next).ptr;
  Memory::Recycler::WBSetBit((char *)&local_30);
  local_30.next.ptr = (Type)(Type)TVar3.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_30);
  NVar5.next.ptr = local_30.next.ptr;
  addr = this->last;
  Memory::Recycler::WBSetBit((char *)addr);
  (addr->next).ptr = (SListNodeBase<Memory::Recycler> *)NVar5.next.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  pSVar8 = (this->super_Iterator).list;
  (this->super_Iterator).current = this->last;
  this->last = (NodeBase *)0x0;
  pRVar1 = &pSVar8->super_RealCount;
  pRVar1->count = pRVar1->count - 1;
  return &pSVar2->super_SListNodeBase<Memory::Recycler>;
}

Assistant:

NodeBase * UnlinkCurrentNode()
        {
            NodeBase * unlinkedNode = const_cast<NodeBase *>(this->current);
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));
            Assert(last != nullptr);

            const_cast<NodeBase *>(last)->Next() = this->current->Next();
            this->current = last;
            last = nullptr;
            const_cast<SListBase *>(this->list)->DecrementCount();
            return unlinkedNode;
        }